

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::Secp256k1::CompressPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *uncompressed_pubkey)

{
  secp256k1_context *ctx;
  undefined8 input;
  int iVar1;
  size_t sVar2;
  CfdException *pCVar3;
  value_type_conflict *__val;
  size_t byte_size;
  secp256k1_pubkey pubkey;
  undefined1 local_a8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  size_t local_70;
  undefined1 local_68 [64];
  
  ctx = (secp256k1_context *)this->secp256k1_context_;
  if (ctx == (secp256k1_context *)0x0) {
    local_68._0_8_ = "cfdcore_secp256k1.cpp";
    local_68._8_4_ = 0x77;
    local_68._16_8_ = "CompressPubkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"Secp256k1 context is NULL.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Secp256k1 context is NULL.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar2 = ByteData::GetDataSize(uncompressed_pubkey);
  if (sVar2 == 0x41) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,
                       uncompressed_pubkey);
    input = local_a8._0_8_;
    sVar2 = ByteData::GetDataSize(uncompressed_pubkey);
    iVar1 = secp256k1_ec_pubkey_parse
                      (ctx,(secp256k1_pubkey_conflict *)local_68,(uchar *)input,sVar2);
    if ((uchar *)local_a8._0_8_ != (uchar *)0x0) {
      operator_delete((void *)local_a8._0_8_);
    }
    if (iVar1 == 1) {
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x21;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x10] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x11] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x12] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x13] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x14] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x15] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x16] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x17] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x18] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x19] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1a] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1b] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1c] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1d] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1e] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x1f] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[1] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[2] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[3] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[4] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[5] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[6] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[7] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[8] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[9] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[10] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xb] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xc] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xd] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xe] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0xf] = '\0';
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[0x20] = '\0';
      local_70 = 0x21;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      iVar1 = secp256k1_ec_pubkey_serialize
                        (ctx,local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,&local_70,
                         (secp256k1_pubkey_conflict *)local_68,0x102);
      if (iVar1 == 1) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,local_70);
        ByteData::ByteData(__return_storage_ptr__,&local_88);
        if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return __return_storage_ptr__;
      }
      local_a8._0_8_ = "cfdcore_secp256k1.cpp";
      local_a8._8_4_ = 0x92;
      local_a8._16_8_ = "CompressPubkeySecp256k1Ec";
      logger::log<>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,
                    "Secp256k1 pubkey serialize Error.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_a8._0_8_ = local_a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,"Secp256k1 pubkey serialize Error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_a8._0_8_ = "cfdcore_secp256k1.cpp";
    local_a8._8_4_ = 0x87;
    local_a8._16_8_ = "CompressPubkeySecp256k1Ec";
    logger::log<>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"Secp256k1 pubkey parse Error.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Secp256k1 pubkey parse Error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_a8);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_68._0_8_ = "cfdcore_secp256k1.cpp";
  local_68._8_4_ = 0x7d;
  local_68._16_8_ = "CompressPubkeySecp256k1Ec";
  logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"Invalid Argument pubkey size.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Invalid Pubkey size.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::CompressPubkeySecp256k1Ec(
    const ByteData& uncompressed_pubkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (uncompressed_pubkey.GetDataSize() != 65) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }

  secp256k1_pubkey pubkey;
  int ret = secp256k1_ec_pubkey_parse(
      context, &pubkey, uncompressed_pubkey.GetBytes().data(),
      uncompressed_pubkey.GetDataSize());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }

  std::vector<uint8_t> byte_data(33);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &pubkey, SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}